

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.hh
# Opt level: O0

void __thiscall kratos::Attribute::~Attribute(Attribute *this)

{
  Attribute *this_local;
  
  this->_vptr_Attribute = (_func_int **)&PTR__Attribute_0059bde0;
  std::shared_ptr<void>::~shared_ptr(&this->target_);
  std::__cxx11::string::~string((string *)&this->value_str);
  std::__cxx11::string::~string((string *)&this->type_str);
  return;
}

Assistant:

virtual ~Attribute() = default;